

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Count<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Count<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
  bVar2;
  iterator first;
  iterator last;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_5b8;
  string local_5b0;
  Message local_590;
  size_t local_588;
  int local_57c;
  undefined1 local_578 [8];
  AssertionResult gtest_ar_1;
  pair<const_phmap::priv::NonStandardLayout,_int> *p_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *__range2_1;
  AssertHelper local_538;
  string local_530;
  Message local_510;
  size_t local_508;
  int local_4fc;
  undefined1 local_4f8 [8];
  AssertionResult gtest_ar;
  pair<const_phmap::priv::NonStandardLayout,_int> *p;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  *__range2;
  TypeParam m;
  undefined1 local_28 [8];
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  values;
  Count<phmap::parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>_>
  *this_local;
  
  values.
  super__Vector_base<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
            *)local_28);
  bVar2 = std::
          back_inserter<std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>
                    ((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                      *)local_28);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       generate_n<std::back_insert_iterator<std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<phmap::priv::NonStandardLayout_const,int>,void>>
                 (bVar2.container,10);
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)&__range2);
  __end0 = std::
           vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
           ::begin((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                    *)local_28);
  p = (pair<const_phmap::priv::NonStandardLayout,_int> *)
      std::
      vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
      ::end((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
                                     *)&p), bVar1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
           ::operator*(&__end0);
    local_4fc = 0;
    local_508 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                ::count<phmap::priv::NonStandardLayout>
                          ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                            *)&__range2,
                           (key_arg<phmap::priv::NonStandardLayout> *)
                           gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_4f8,"0","m.count(p.first)",&local_4fc,&local_508);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4f8);
    if (!bVar1) {
      testing::Message::Message(&local_510);
      testing::PrintToString<phmap::priv::NonStandardLayout>
                (&local_530,
                 (NonStandardLayout *)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
      pMVar3 = testing::Message::operator<<(&local_510,&local_530);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4f8);
      testing::internal::AssertHelper::AssertHelper
                (&local_538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_538,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_538);
      std::__cxx11::string::~string((string *)&local_530);
      testing::Message::~Message(&local_510);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4f8);
    __gnu_cxx::
    __normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
    ::operator++(&__end0);
  }
  first = std::
          vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
          ::begin((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                   *)local_28);
  last = std::
         vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
         ::end((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                *)local_28);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::NonStandardLayout_const,int>*,std::vector<std::pair<phmap::priv::NonStandardLayout_const,int>,std::allocator<std::pair<phmap::priv::NonStandardLayout_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
              *)&__range2,
             (__normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
              )last._M_current);
  __end0_1 = std::
             vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             ::begin((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                      *)local_28);
  p_1 = (pair<const_phmap::priv::NonStandardLayout,_int> *)
        std::
        vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
        ::end((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
               *)local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
                             *)&p_1), bVar1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
           ::operator*(&__end0_1);
    local_57c = 1;
    local_588 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                ::count<phmap::priv::NonStandardLayout>
                          ((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
                            *)&__range2,
                           (key_arg<phmap::priv::NonStandardLayout> *)
                           gtest_ar_1.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_578,"1","m.count(p.first)",&local_57c,&local_588);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_578);
    if (!bVar1) {
      testing::Message::Message(&local_590);
      testing::PrintToString<phmap::priv::NonStandardLayout>
                (&local_5b0,
                 (NonStandardLayout *)
                 gtest_ar_1.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
      pMVar3 = testing::Message::operator<<(&local_590,&local_5b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_578);
      testing::internal::AssertHelper::AssertHelper
                (&local_5b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5b8,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_5b8);
      std::__cxx11::string::~string((string *)&local_5b0);
      testing::Message::~Message(&local_590);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_578);
    __gnu_cxx::
    __normal_iterator<std::pair<const_phmap::priv::NonStandardLayout,_int>_*,_std::vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>_>
    ::operator++(&__end0_1);
  }
  parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::NonStandardLayout,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>,_4UL,_phmap::NullMutex>
              *)&__range2);
  std::
  vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
  ::~vector((vector<std::pair<const_phmap::priv::NonStandardLayout,_int>,_std::allocator<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
             *)local_28);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, Count) {
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values)
    EXPECT_EQ(0, m.count(p.first)) << ::testing::PrintToString(p.first);
  m.insert(values.begin(), values.end());
  for (const auto& p : values)
    EXPECT_EQ(1, m.count(p.first)) << ::testing::PrintToString(p.first);
}